

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFAcceleratorTable.cpp
# Opt level: O1

void __thiscall llvm::DWARFDebugNames::NameIndex::dumpCUs(NameIndex *this,ScopedPrinter *W)

{
  raw_ostream *this_00;
  uint32_t CU;
  StringRef N;
  format_object_base local_58;
  uint64_t local_48;
  uint32_t local_40;
  DelimitedScope<_[_,__]_> local_38;
  ListScope CUScope;
  
  N.Length = 0x18;
  N.Data = "Compilation Unit offsets";
  DelimitedScope<'[',_']'>::DelimitedScope(&local_38,W,N);
  if ((this->Hdr).super_HeaderPOD.CompUnitCount != 0) {
    CU = 0;
    do {
      ScopedPrinter::printIndent(W);
      this_00 = W->OS;
      local_48 = getCUOffset(this,CU);
      local_58.Fmt = "CU[%u]: 0x%08lx\n";
      local_58._vptr_format_object_base = (_func_int **)&PTR_home_01098010;
      local_40 = CU;
      raw_ostream::operator<<(this_00,&local_58);
      CU = CU + 1;
    } while (CU < (this->Hdr).super_HeaderPOD.CompUnitCount);
  }
  DelimitedScope<'[',_']'>::~DelimitedScope(&local_38);
  return;
}

Assistant:

void DWARFDebugNames::NameIndex::dumpCUs(ScopedPrinter &W) const {
  ListScope CUScope(W, "Compilation Unit offsets");
  for (uint32_t CU = 0; CU < Hdr.CompUnitCount; ++CU)
    W.startLine() << format("CU[%u]: 0x%08" PRIx64 "\n", CU, getCUOffset(CU));
}